

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffexist(char *infile,int *exists,int *status)

{
  int iVar1;
  char *pcVar2;
  int *rootname_00;
  FILE *diskfile;
  char rootname [1025];
  FILE *local_430;
  int local_428 [260];
  
  if (0 < *status) {
    return *status;
  }
  rootname_00 = local_428;
  ffrtnm(infile,(char *)rootname_00,status);
  pcVar2 = strstr((char *)rootname_00,"://");
  if ((pcVar2 != (char *)0x0) || ((char)local_428[0] == '-')) {
    if (local_428[0] != 0x656c6966) {
      *exists = -1;
      goto LAB_0012fc69;
    }
    rootname_00 = (int *)(pcVar2 + 3);
  }
  iVar1 = file_openfile((char *)rootname_00,0,(FILE **)&local_430);
  if (iVar1 == 0) {
    *exists = 1;
    fclose(local_430);
  }
  else {
    iVar1 = file_is_compressed((char *)rootname_00);
    if (iVar1 == 0) {
      *exists = 0;
    }
    else {
      *exists = 2;
    }
  }
LAB_0012fc69:
  return *status;
}

Assistant:

int ffexist(const char *infile, /* I - input filename or URL */
            int *exists,        /* O -  2 = a compressed version of file exists */
	                        /*      1 = yes, disk file exists               */
	                        /*      0 = no, disk file could not be found    */
				/*     -1 = infile is not a disk file (could    */
				/*   be a http, ftp, gsiftp, smem, or stdin file) */
            int *status)        /* I/O  status  */

/*
   test if the input file specifier is an existing file on disk
   If the specified file can't be found, it then searches for a 
   compressed version of the file.
*/
{
    FILE *diskfile;
    char rootname[FLEN_FILENAME];
    char *ptr1;
    
    if (*status > 0)
        return(*status);

    /* strip off any extname or filters from the name */
    ffrtnm( (char *)infile, rootname, status);

    ptr1 = strstr(rootname, "://");
    
    if (ptr1 || *rootname == '-') {
        if (!strncmp(rootname, "file", 4) ) {
	    ptr1 = ptr1 + 3;   /* pointer to start of the disk file name */
	} else {
	    *exists = -1;   /* this is not a disk file */
	    return (*status);
	}
    } else {
        ptr1 = rootname;
    }
    
    /* see if the disk file exists */
    if (file_openfile(ptr1, 0, &diskfile)) {
    
        /* no, couldn't open file, so see if there is a compressed version */
        if (file_is_compressed(ptr1) ) {
           *exists = 2;  /* a compressed version of the file exists */
        } else {
	   *exists = 0;  /* neither file nor compressed version exist */
	}
	
    } else {
    
        /* yes, file exists */
        *exists = 1; 
	fclose(diskfile);
    }
    	   
    return(*status);
}